

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> * __thiscall
cmGeneratorTarget::GetLanguageStandardProperty(cmGeneratorTarget *this,string *lang,string *config)

{
  cmTarget *this_00;
  bool bVar1;
  pointer ppVar2;
  string local_b8;
  undefined4 local_94;
  _Self local_90;
  _Self local_88;
  const_iterator langStandardIter;
  char local_69;
  string local_68;
  undefined1 local_48 [8];
  string key;
  string *config_local;
  string *lang_local;
  cmGeneratorTarget *this_local;
  
  key.field_2._8_8_ = config;
  cmsys::SystemTools::UpperCase(&local_68,config);
  local_69 = '-';
  cmStrCat<std::__cxx11::string,char,std::__cxx11::string_const&>
            ((string *)local_48,&local_68,&local_69,lang);
  std::__cxx11::string::~string((string *)&local_68);
  local_88._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
       ::find(&this->LanguageStandardMap,(key_type *)local_48);
  local_90._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
       ::end(&this->LanguageStandardMap);
  bVar1 = std::operator!=(&local_88,&local_90);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator->(&local_88);
    this_local = (cmGeneratorTarget *)&ppVar2->second;
  }
  else {
    this_00 = this->Target;
    cmStrCat<std::__cxx11::string_const&,char_const(&)[10]>(&local_b8,lang,(char (*) [10])0x1248af8)
    ;
    this_local = (cmGeneratorTarget *)cmTarget::GetLanguageStandardProperty(this_00,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  local_94 = 1;
  std::__cxx11::string::~string((string *)local_48);
  return (BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
         this_local;
}

Assistant:

BTs<std::string> const* cmGeneratorTarget::GetLanguageStandardProperty(
  std::string const& lang, std::string const& config) const
{
  std::string key = cmStrCat(cmSystemTools::UpperCase(config), '-', lang);
  auto langStandardIter = this->LanguageStandardMap.find(key);
  if (langStandardIter != this->LanguageStandardMap.end()) {
    return &langStandardIter->second;
  }

  return this->Target->GetLanguageStandardProperty(
    cmStrCat(lang, "_STANDARD"));
}